

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSet::matchesIndexValue(UnicodeSet *this,uint8_t v)

{
  int32_t iVar1;
  uint uVar2;
  uint uVar3;
  UnicodeString *this_00;
  UChar32 c;
  UnicodeString *s;
  UChar32 high;
  UChar32 low;
  int32_t rangeCount;
  int32_t i;
  uint8_t v_local;
  UnicodeSet *this_local;
  
  iVar1 = getRangeCount(this);
  low = 0;
  do {
    if (iVar1 <= low) {
      iVar1 = UVector::size(this->strings);
      if (iVar1 != 0) {
        for (low = 0; iVar1 = UVector::size(this->strings), low < iVar1; low = low + 1) {
          this_00 = (UnicodeString *)UVector::elementAt(this->strings,low);
          uVar2 = UnicodeString::char32At(this_00,0);
          if ((uVar2 & 0xff) == (uint)v) {
            return '\x01';
          }
        }
      }
      return '\0';
    }
    uVar2 = getRangeStart(this,low);
    uVar3 = getRangeEnd(this,low);
    if ((uVar2 & 0xffffff00) == (uVar3 & 0xffffff00)) {
      if (((uVar2 & 0xff) <= (uint)v) && ((uint)v <= (uVar3 & 0xff))) {
        return '\x01';
      }
    }
    else if (((uVar2 & 0xff) <= (uint)v) || ((uint)v <= (uVar3 & 0xff))) {
      return '\x01';
    }
    low = low + 1;
  } while( true );
}

Assistant:

UBool UnicodeSet::matchesIndexValue(uint8_t v) const {
    /* The index value v, in the range [0,255], is contained in this set if
     * it is contained in any pair of this set.  Pairs either have the high
     * bytes equal, or unequal.  If the high bytes are equal, then we have
     * aaxx..aayy, where aa is the high byte.  Then v is contained if xx <=
     * v <= yy.  If the high bytes are unequal we have aaxx..bbyy, bb>aa.
     * Then v is contained if xx <= v || v <= yy.  (This is identical to the
     * time zone month containment logic.)
     */
    int32_t i;
    int32_t rangeCount=getRangeCount();
    for (i=0; i<rangeCount; ++i) {
        UChar32 low = getRangeStart(i);
        UChar32 high = getRangeEnd(i);
        if ((low & ~0xFF) == (high & ~0xFF)) {
            if ((low & 0xFF) <= v && v <= (high & 0xFF)) {
                return TRUE;
            }
        } else if ((low & 0xFF) <= v || v <= (high & 0xFF)) {
            return TRUE;
        }
    }
    if (strings->size() != 0) {
        for (i=0; i<strings->size(); ++i) {
            const UnicodeString& s = *(const UnicodeString*)strings->elementAt(i);
            //if (s.length() == 0) {
            //    // Empty strings match everything
            //    return TRUE;
            //}
            // assert(s.length() != 0); // We enforce this elsewhere
            UChar32 c = s.char32At(0);
            if ((c & 0xFF) == v) {
                return TRUE;
            }
        }
    }
    return FALSE;
}